

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
* __thiscall
cmCTest::Private::GetNamedTestingHandlers_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
           *__return_storage_ptr__,Private *this)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  __l;
  allocator_type local_1ba;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1b9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_1b8;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  cmCTestBuildAndTestHandler *local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  cmCTestCoverageHandler *local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  cmCTestScriptHandler *local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  cmCTestTestHandler *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  cmCTestUpdateHandler *local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  cmCTestConfigureHandler *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  cmCTestMemCheckHandler *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  cmCTestSubmitHandler *local_58;
  long *local_50 [2];
  long local_40 [2];
  cmCTestUploadHandler *local_30;
  
  local_1b8.first._M_dataplus._M_p = (pointer)&local_1b8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"build","");
  local_190[0] = local_180;
  local_1b8.second = &(this->BuildHandler).super_cmCTestGenericHandler;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"buildtest","");
  local_170 = &this->BuildAndTestHandler;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"coverage","");
  local_148 = &this->CoverageHandler;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"script","");
  local_120 = &this->ScriptHandler;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"test","");
  local_f8 = &this->TestHandler;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"update","");
  local_d0 = &this->UpdateHandler;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"configure","");
  local_a8 = &this->ConfigureHandler;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"memcheck","");
  local_80 = &this->MemCheckHandler;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"submit","");
  local_58 = &this->SubmitHandler;
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"upload","");
  local_30 = &this->UploadHandler;
  __l._M_len = 10;
  __l._M_array = &local_1b8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  ::map(__return_storage_ptr__,__l,&local_1b9,&local_1ba);
  lVar1 = -400;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -5;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, cmCTestGenericHandler*> GetNamedTestingHandlers()
  {
    return { { "build", &this->BuildHandler },
             { "buildtest", &this->BuildAndTestHandler },
             { "coverage", &this->CoverageHandler },
             { "script", &this->ScriptHandler },
             { "test", &this->TestHandler },
             { "update", &this->UpdateHandler },
             { "configure", &this->ConfigureHandler },
             { "memcheck", &this->MemCheckHandler },
             { "submit", &this->SubmitHandler },
             { "upload", &this->UploadHandler } };
  }